

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O2

Trie * __thiscall
Gudhi::skeleton_blocker::
Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::build_trie(Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *this,Link_vertex_handle link_vh,Trie *parent)

{
  Link_vertex_handle link_vh_00;
  pointer psVar1;
  type_conflict1 tVar2;
  Vertex_handle VVar3;
  int iVar4;
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *this_00;
  Trie *child;
  Simplex simplex_node_plus_nv;
  Complex *local_b0;
  boost_vertex_handle local_a8;
  _Rb_tree_header *local_a0;
  unsigned_long local_98;
  Graph *local_90;
  _Rb_tree_header *local_88;
  unsigned_long local_80;
  Graph *local_78;
  Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  local_70;
  
  this_00 = (Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             *)operator_new(0x28);
  VVar3 = parent_vertex(this,link_vh);
  (this_00->v).vertex = VVar3.vertex;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->parent_ = parent;
  local_b0 = (Complex *)
             (this->link_v).
             super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_98 = (unsigned_long)link_vh.vertex;
  local_90 = &local_b0->skeleton;
  psVar1 = (local_b0->skeleton).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = &psVar1[local_98].super_StoredVertex.m_out_edges._M_t._M_impl.super__Rb_tree_header;
  local_70.current_.
  super_iterator_adaptor<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_unsigned_long,_boost::use_default,_unsigned_long,_long>
  .m_iterator.
  super_iterator_adaptor<boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  .m_iterator._M_node =
       (_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>
        )psVar1[local_98].super_StoredVertex.m_out_edges._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_left;
  local_a8 = link_vh.vertex;
  local_88 = local_a0;
  local_80 = local_98;
  local_78 = local_90;
  local_70.complex = local_b0;
  local_70.v.vertex = link_vh.vertex;
  local_70.current_.
  super_iterator_adaptor<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_unsigned_long,_boost::use_default,_unsigned_long,_long>
  .m_iterator.m_src = local_98;
  local_70.current_.m_g = local_90;
  local_70.end_.
  super_iterator_adaptor<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_unsigned_long,_boost::use_default,_unsigned_long,_long>
  .m_iterator.
  super_iterator_adaptor<boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  .m_iterator._M_node =
       (_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>
        )(_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>
          )local_a0;
  local_70.end_.
  super_iterator_adaptor<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_unsigned_long,_boost::use_default,_unsigned_long,_long>
  .m_iterator.m_src = local_98;
  local_70.end_.m_g = local_90;
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                        *)&local_70,
                       (iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                        *)&local_b0);
    if (!tVar2) break;
    link_vh_00.vertex =
         ((_Base_ptr)
         ((long)local_70.current_.
                super_iterator_adaptor<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_long>,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_unsigned_long,_boost::use_default,_unsigned_long,_long>
                .m_iterator.
                super_iterator_adaptor<boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                .m_iterator._M_node + 0x20))->_M_color;
    if (link_vh.vertex < link_vh_00.vertex) {
      Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ::simplex((Simplex *)&simplex_node_plus_nv,this_00);
      VVar3 = parent_vertex(this,link_vh_00);
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::add_vertex((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)&simplex_node_plus_nv,(Vertex_handle)VVar3.vertex);
      iVar4 = (*this->complex->_vptr_Skeleton_blocker_complex[9])
                        (this->complex,
                         (_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                          *)&simplex_node_plus_nv);
      if ((char)iVar4 != '\0') {
        child = build_trie(this,link_vh_00,this_00);
        Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
        ::add_child(this_00,child);
      }
      std::
      _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                   *)&simplex_node_plus_nv);
    }
    Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
    ::increment(&local_70);
  }
  return this_00;
}

Assistant:

Trie* build_trie(Link_vertex_handle link_vh, Trie* parent) {
    Trie* res = new Trie(parent_vertex(link_vh), parent);
    for (Link_vertex_handle nv : link_v->vertex_range(link_vh)) {
      if (link_vh < nv) {
        Simplex simplex_node_plus_nv(res->simplex());
        simplex_node_plus_nv.add_vertex(parent_vertex(nv));
        if (complex->contains(simplex_node_plus_nv)) {
          res->add_child(build_trie(nv, res));
        }
      }
    }
    return res;
  }